

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_reference pvVar4;
  Result local_40;
  Enum local_3c;
  Enum local_38;
  Type local_34;
  Enum local_30;
  Type local_2c;
  Type local_28;
  Type result_type;
  Type type2;
  Type type1;
  TypeVector *expected_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Type::Type(&result_type,Any);
  Type::Type(&local_28,Any);
  Type::Type(&local_2c,Any);
  Type::Type(&local_34,I32);
  local_30 = (Enum)PeekAndCheckType(this,0,local_34);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  local_38 = (Enum)PeekType(this,1,&result_type);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_38);
  local_3c = (Enum)PeekType(this,2,&local_28);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(expected);
  if (bVar1) {
    bVar1 = Type::IsRef(&result_type);
    if ((bVar1) || (bVar1 = Type::IsRef(&local_28), bVar1)) {
      Result::Result(&local_40,Error);
      this_local._4_4_ = local_40.enum_;
    }
    else {
      RVar2 = CheckType(result_type,local_28);
      Result::operator|=((Result *)((long)&this_local + 4),RVar2);
      local_2c.enum_ = result_type.enum_;
    }
  }
  else {
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(expected);
    if (sVar3 != 1) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/type-checker.cc"
                    ,0x2ed,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,0);
    RVar2 = CheckType(result_type,(Type)pvVar4->enum_);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](expected,0);
    RVar2 = CheckType(local_28,(Type)pvVar4->enum_);
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
            (this,this_local._4_4_,"select",local_2c,local_2c,I32);
  RVar2 = DropTypes(this,3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  PushType(this,local_2c);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}